

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

value * __thiscall cppcms::json::value::find(value *this,char *cpath)

{
  bool bVar1;
  int iVar2;
  json_type jVar3;
  pointer ppVar4;
  string_key *psVar5;
  value *in_RDI;
  const_iterator p;
  object *obj;
  string_key part;
  size_t new_pos;
  size_t pos;
  value *ptr;
  string_key path;
  map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
  *in_stack_fffffffffffffef8;
  string_key *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  object *in_stack_ffffffffffffff18;
  char in_stack_ffffffffffffff27;
  string_key *in_stack_ffffffffffffff28;
  const_iterator in_stack_ffffffffffffff38;
  _Rb_tree_const_iterator<std::pair<const_cppcms::string_key,_cppcms::json::value>_> local_b8;
  object *local_b0;
  int local_a4;
  string_key *local_70;
  string_key *local_68;
  value *local_60;
  value *local_8;
  
  string_key::unowned(in_stack_ffffffffffffff08);
  if (find(char_const*)::empty == '\0') {
    iVar2 = __cxa_guard_acquire(&find(char_const*)::empty);
    if (iVar2 != 0) {
      value((value *)0x3e345f);
      __cxa_atexit(~value,&find::empty,&__dso_handle);
      __cxa_guard_release(&find(char_const*)::empty);
    }
  }
  local_68 = (string_key *)0x0;
  local_60 = in_RDI;
  do {
    in_stack_ffffffffffffff28 =
         (string_key *)
         string_key::find(in_stack_ffffffffffffff28,in_stack_ffffffffffffff27,
                          (size_t)in_stack_ffffffffffffff18);
    local_70 = in_stack_ffffffffffffff28;
    string_key::unowned_substr
              ((string_key *)in_stack_ffffffffffffff38._M_node,(size_t)in_RDI,
               (size_t)in_stack_ffffffffffffff28);
    if (local_70 != (string_key *)0xffffffffffffffff) {
      local_70 = (string_key *)((long)&local_70->begin_ + 1);
    }
    in_stack_ffffffffffffff27 = string_key::empty(in_stack_ffffffffffffff00);
    if ((bool)in_stack_ffffffffffffff27) {
      local_8 = &find::empty;
      local_a4 = 1;
    }
    else {
      jVar3 = type((value *)0x3e35ba);
      if (jVar3 == is_object) {
        in_stack_ffffffffffffff18 = object((value *)0x3e35f2);
        local_b0 = in_stack_ffffffffffffff18;
        std::_Rb_tree_const_iterator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>::
        _Rb_tree_const_iterator(&local_b8);
        local_b8._M_node =
             (_Base_ptr)
             std::
             map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
             ::find(in_stack_fffffffffffffef8,(key_type *)0x3e361c);
        in_stack_ffffffffffffff38 =
             std::
             map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
             ::end(in_stack_fffffffffffffef8);
        bVar1 = std::operator==(&local_b8,(_Self *)&stack0xffffffffffffff38);
        if (bVar1) {
          local_8 = &find::empty;
          local_a4 = 1;
        }
        else {
          ppVar4 = std::
                   _Rb_tree_const_iterator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>
                   ::operator->((_Rb_tree_const_iterator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>
                                 *)0x3e367e);
          local_60 = &ppVar4->second;
          local_68 = local_70;
          local_a4 = 0;
        }
      }
      else {
        local_8 = &find::empty;
        local_a4 = 1;
      }
    }
    string_key::~string_key((string_key *)0x3e36ac);
    if (local_a4 != 0) goto LAB_003e3704;
    in_stack_ffffffffffffff00 = local_70;
    psVar5 = (string_key *)string_key::size(local_70);
  } while (in_stack_ffffffffffffff00 < psVar5);
  local_8 = local_60;
  local_a4 = 1;
LAB_003e3704:
  string_key::~string_key((string_key *)0x3e3711);
  return local_8;
}

Assistant:

value const &value::find(char const *cpath) const
	{
		string_key path=string_key::unowned(cpath);
		static value const empty;
		value const *ptr=this;
		size_t pos=0;
		size_t new_pos;
		do {
			new_pos=path.find('.',pos);
			string_key const part=path.unowned_substr(pos,new_pos - pos);
			if(new_pos!=std::string::npos)
				new_pos++;
			if(part.empty())
				return empty;
			if(ptr->type()!=json::is_object)
				return empty;
			json::object const &obj=ptr->object();
			json::object::const_iterator p;
			if((p=obj.find(part))==obj.end())
				return empty;
			ptr=&p->second;
			pos=new_pos;

		} while(new_pos < path.size());
		return *ptr;
	}